

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O1

double __thiscall
AnyDistributionEdgeCalculator::insertSizeSumRightTail(AnyDistributionEdgeCalculator *this,int k)

{
  pointer pdVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = k - this->insert_size_sum_ccdf_offset;
  if (k < this->insert_size_sum_ccdf_offset) {
    return 1.0;
  }
  pdVar1 = (this->insert_size_sum_ccdf->super__Vector_base<double,_std::allocator<double>_>)._M_impl
           .super__Vector_impl_data._M_start;
  uVar2 = (long)(this->insert_size_sum_ccdf->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  dVar4 = 0.0;
  if (iVar3 < (int)uVar2) {
    if (uVar2 <= (ulong)(long)iVar3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    dVar4 = pdVar1[iVar3];
  }
  return dVar4;
}

Assistant:

double AnyDistributionEdgeCalculator::insertSizeSumRightTail(int k) const {
	if (k<insert_size_sum_ccdf_offset) return 1.0;
	int i = k - insert_size_sum_ccdf_offset;
	if (i < (int)insert_size_sum_ccdf->size()) {
		return insert_size_sum_ccdf->at(i);
	} else {
		return 0.0;
	}
}